

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O3

CompressionFunction *
duckdb::ConstantFun::GetFunction(CompressionFunction *__return_storage_ptr__,PhysicalType data_type)

{
  code *pcVar1;
  InternalException *this;
  code *pcVar2;
  code *pcVar3;
  int iVar4;
  undefined7 in_register_00000031;
  code *pcVar5;
  code *pcVar6;
  string local_40;
  
  iVar4 = (int)CONCAT71(in_register_00000031,data_type);
  if (iVar4 < 0xcb) {
    switch(iVar4) {
    case 1:
    case 3:
      pcVar1 = ConstantFetchRow<signed_char>;
      pcVar2 = ConstantSelect<signed_char>;
      pcVar3 = ConstantScanPartial<signed_char>;
      pcVar5 = ConstantScanFunction<signed_char>;
      break;
    case 2:
      pcVar1 = ConstantFetchRow<unsigned_char>;
      pcVar2 = ConstantSelect<unsigned_char>;
      pcVar3 = ConstantScanPartial<unsigned_char>;
      pcVar5 = ConstantScanFunction<unsigned_char>;
      break;
    case 4:
      pcVar1 = ConstantFetchRow<unsigned_short>;
      pcVar2 = ConstantSelect<unsigned_short>;
      pcVar3 = ConstantScanPartial<unsigned_short>;
      pcVar5 = ConstantScanFunction<unsigned_short>;
      break;
    case 5:
      pcVar1 = ConstantFetchRow<short>;
      pcVar2 = ConstantSelect<short>;
      pcVar3 = ConstantScanPartial<short>;
      pcVar5 = ConstantScanFunction<short>;
      break;
    case 6:
      pcVar1 = ConstantFetchRow<unsigned_int>;
      pcVar2 = ConstantSelect<unsigned_int>;
      pcVar3 = ConstantScanPartial<unsigned_int>;
      pcVar5 = ConstantScanFunction<unsigned_int>;
      break;
    case 7:
      pcVar1 = ConstantFetchRow<int>;
      pcVar2 = ConstantSelect<int>;
      pcVar3 = ConstantScanPartial<int>;
      pcVar5 = ConstantScanFunction<int>;
      break;
    case 8:
      pcVar1 = ConstantFetchRow<unsigned_long>;
      pcVar2 = ConstantSelect<unsigned_long>;
      pcVar3 = ConstantScanPartial<unsigned_long>;
      pcVar5 = ConstantScanFunction<unsigned_long>;
      break;
    case 9:
      pcVar1 = ConstantFetchRow<long>;
      pcVar2 = ConstantSelect<long>;
      pcVar3 = ConstantScanPartial<long>;
      pcVar5 = ConstantScanFunction<long>;
      break;
    default:
switchD_0056be56_caseD_a:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unsupported type for ConstantUncompressed::GetFunction","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case 0xb:
      pcVar1 = ConstantFetchRow<float>;
      pcVar2 = ConstantSelect<float>;
      pcVar3 = ConstantScanPartial<float>;
      pcVar5 = ConstantScanFunction<float>;
      break;
    case 0xc:
      pcVar1 = ConstantFetchRow<double>;
      pcVar2 = ConstantSelect<double>;
      pcVar3 = ConstantScanPartial<double>;
      pcVar5 = ConstantScanFunction<double>;
    }
  }
  else if (iVar4 == 0xcb) {
    pcVar1 = ConstantFetchRow<duckdb::uhugeint_t>;
    pcVar2 = ConstantSelect<duckdb::uhugeint_t>;
    pcVar3 = ConstantScanPartial<duckdb::uhugeint_t>;
    pcVar5 = ConstantScanFunction<duckdb::uhugeint_t>;
  }
  else {
    if (iVar4 != 0xcc) {
      if (iVar4 != 0xce) goto switchD_0056be56_caseD_a;
      pcVar1 = ConstantFetchRowValidity;
      pcVar6 = ConstantFilterValidity;
      pcVar2 = ConstantSelectValidity;
      pcVar3 = ConstantScanPartialValidity;
      pcVar5 = ConstantScanFunctionValidity;
      goto LAB_0056c022;
    }
    pcVar1 = ConstantFetchRow<duckdb::hugeint_t>;
    pcVar2 = ConstantSelect<duckdb::hugeint_t>;
    pcVar3 = ConstantScanPartial<duckdb::hugeint_t>;
    pcVar5 = ConstantScanFunction<duckdb::hugeint_t>;
  }
  pcVar6 = (compression_filter_t)0x0;
LAB_0056c022:
  __return_storage_ptr__->type = COMPRESSION_CONSTANT;
  __return_storage_ptr__->data_type = data_type;
  __return_storage_ptr__->init_analyze = (compression_init_analyze_t)0x0;
  __return_storage_ptr__->analyze = (compression_analyze_t)0x0;
  __return_storage_ptr__->final_analyze = (compression_final_analyze_t)0x0;
  __return_storage_ptr__->init_compression = (compression_init_compression_t)0x0;
  __return_storage_ptr__->compress = (compression_compress_data_t)0x0;
  __return_storage_ptr__->compress_finalize = (compression_compress_finalize_t)0x0;
  __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
  __return_storage_ptr__->init_scan = ConstantInitScan;
  __return_storage_ptr__->scan_vector = pcVar5;
  __return_storage_ptr__->scan_partial = pcVar3;
  __return_storage_ptr__->select = pcVar2;
  __return_storage_ptr__->filter = pcVar6;
  __return_storage_ptr__->fetch_row = pcVar1;
  __return_storage_ptr__->skip = UncompressedFunctions::EmptySkip;
  __return_storage_ptr__->init_segment = (compression_init_segment_t)0x0;
  __return_storage_ptr__->init_append = (compression_init_append_t)0x0;
  __return_storage_ptr__->append = (compression_append_t)0x0;
  __return_storage_ptr__->finalize_append = (compression_finalize_append_t)0x0;
  __return_storage_ptr__->revert_append = (compression_revert_append_t)0x0;
  __return_storage_ptr__->serialize_state = (compression_serialize_state_t)0x0;
  __return_storage_ptr__->deserialize_state = (compression_deserialize_state_t)0x0;
  __return_storage_ptr__->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->get_segment_info + 1) = 0;
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction ConstantFun::GetFunction(PhysicalType data_type) {
	switch (data_type) {
	case PhysicalType::BIT:
		return ConstantGetFunctionValidity(data_type);
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return ConstantGetFunction<int8_t>(data_type);
	case PhysicalType::INT16:
		return ConstantGetFunction<int16_t>(data_type);
	case PhysicalType::INT32:
		return ConstantGetFunction<int32_t>(data_type);
	case PhysicalType::INT64:
		return ConstantGetFunction<int64_t>(data_type);
	case PhysicalType::UINT8:
		return ConstantGetFunction<uint8_t>(data_type);
	case PhysicalType::UINT16:
		return ConstantGetFunction<uint16_t>(data_type);
	case PhysicalType::UINT32:
		return ConstantGetFunction<uint32_t>(data_type);
	case PhysicalType::UINT64:
		return ConstantGetFunction<uint64_t>(data_type);
	case PhysicalType::INT128:
		return ConstantGetFunction<hugeint_t>(data_type);
	case PhysicalType::UINT128:
		return ConstantGetFunction<uhugeint_t>(data_type);
	case PhysicalType::FLOAT:
		return ConstantGetFunction<float>(data_type);
	case PhysicalType::DOUBLE:
		return ConstantGetFunction<double>(data_type);
	default:
		throw InternalException("Unsupported type for ConstantUncompressed::GetFunction");
	}
}